

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Erase(ExtensionSet *this,int key)

{
  uint16_t uVar1;
  int iVar2;
  KeyValue *this_00;
  long lVar3;
  long lVar4;
  int local_c;
  
  uVar1 = this->flat_size_;
  this_00 = (this->map_).flat;
  local_c = key;
  if ((long)(short)uVar1 < 0) {
    absl::lts_20240722::container_internal::
    btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
    ::erase<int>((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                  *)this_00,&local_c);
  }
  else if (uVar1 != 0) {
    lVar4 = (long)(short)uVar1 * 0x20;
    lVar3 = 0;
    do {
      iVar2 = *(int *)((long)&((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                                *)(&(this_00->second).cached_size + -5))->root_ + lVar3);
      if (iVar2 != key && key <= iVar2) {
        return;
      }
      if (iVar2 == key) {
        if (lVar4 + -0x20 != lVar3) {
          memmove((void *)((long)&((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                                    *)(&(this_00->second).cached_size + -5))->root_ + lVar3),
                  (void *)((long)(&this_00[1].second.cached_size + -5) + lVar3),
                  (lVar4 - lVar3) - 0x20);
        }
        this->flat_size_ = this->flat_size_ - 1;
        return;
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar4 != lVar3);
  }
  return;
}

Assistant:

void ExtensionSet::Erase(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    map_.large->erase(key);
    return;
  }
  KeyValue* end = flat_end();
  for (KeyValue* it = flat_begin(); it != end && it->first <= key; ++it) {
    if (it->first == key) {
      std::copy(it + 1, end, it);
      --flat_size_;
      return;
    }
  }
}